

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O3

Result * CoreML::validateSchemaTypesIsMultiArray
                   (Result *__return_storage_ptr__,FeatureDescription *featureDesc,
                   ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,int shapeSizeMin,
                   int shapeSizeMax)

{
  int iVar1;
  string *psVar2;
  pointer pcVar3;
  ostream *poVar4;
  ArrayFeatureType *pAVar5;
  size_t sVar6;
  char *pcVar7;
  FeatureType *pFVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream out;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pFVar8 = featureDesc->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    if (((pFVar8->Type_).multiarraytype_)->datatype_ != allowedArrayFeatureDataType) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unsupported array type \"",0x18)
      ;
      if (pFVar8->_oneof_case_[0] == 5) {
        pAVar5 = (pFVar8->Type_).multiarraytype_;
      }
      else {
        pAVar5 = Specification::ArrayFeatureType::default_instance();
      }
      iVar1 = pAVar5->datatype_;
      if (iVar1 < 0x10020) {
        if (iVar1 == 0) {
          pcVar7 = "INVALID";
        }
        else {
          pcVar7 = "MLArrayDataTypeFLOAT16";
        }
      }
      else if (iVar1 == 0x20020) {
        pcVar7 = "MLArrayDataTypeINT32";
      }
      else if (iVar1 == 0x10040) {
        pcVar7 = "MLArrayDataTypeDOUBLE";
      }
      else {
        pcVar7 = "MLArrayDataTypeFLOAT32";
      }
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar7,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\" for feature \"",0xf);
      psVar2 = (featureDesc->name_).ptr_;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + psVar2->_M_string_length);
      std::__cxx11::string::append((char *)&local_1d8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Should be of: ",0xe);
      if (allowedArrayFeatureDataType < ArrayFeatureType_ArrayDataType_FLOAT32) {
        if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
          pcVar7 = "INVALID";
        }
        else {
          pcVar7 = "MLArrayDataTypeFLOAT16";
        }
      }
      else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INT32) {
        pcVar7 = "MLArrayDataTypeINT32";
      }
      else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_DOUBLE) {
        pcVar7 = "MLArrayDataTypeDOUBLE";
      }
      else {
        pcVar7 = "MLArrayDataTypeFLOAT32";
      }
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1d8);
      goto LAB_00285c3f;
    }
    iVar1 = (((pFVar8->Type_).multiarraytype_)->shape_).current_size_;
    if (shapeSizeMin <= iVar1 && iVar1 <= shapeSizeMax) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unsupported array rank ",0x17);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," should be in range [",0x15);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,shapeSizeMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,shapeSizeMax);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_00285c55;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unsupported type \"",0x12);
    pFVar8 = featureDesc->type_;
    if (pFVar8 == (FeatureType *)0x0) {
      pFVar8 = (FeatureType *)&Specification::_FeatureType_default_instance_;
    }
    if ((ulong)pFVar8->_oneof_case_[0] < 8) {
      pcVar7 = &DAT_003474c4 + *(int *)(&DAT_003474c4 + (ulong)pFVar8->_oneof_case_[0] * 4);
    }
    else {
      pcVar7 = "INVALID";
    }
    sVar6 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar7,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\" for feature \"",0xf);
    psVar2 = (featureDesc->name_).ptr_;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar3,pcVar3 + psVar2->_M_string_length);
    std::__cxx11::string::append((char *)&local_1d8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Should be of: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"MLFeatureTypeType_multiArrayType",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," with data type of: ",0x14);
    if (allowedArrayFeatureDataType < ArrayFeatureType_ArrayDataType_FLOAT32) {
      if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
        pcVar7 = "INVALID";
      }
      else {
        pcVar7 = "MLArrayDataTypeFLOAT16";
      }
    }
    else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INT32) {
      pcVar7 = "MLArrayDataTypeINT32";
    }
    else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_DOUBLE) {
      pcVar7 = "MLArrayDataTypeDOUBLE";
    }
    else {
      pcVar7 = "MLArrayDataTypeFLOAT32";
    }
    sVar6 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1d8);
LAB_00285c3f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_00285c55;
  }
  operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
LAB_00285c55:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateSchemaTypesIsMultiArray(const Specification::FeatureDescription& featureDesc,
                                           Specification::ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,
                                           int shapeSizeMin = 1,
                                           int shapeSizeMax = INT_MAX) {
        // Check the types
        auto& type = featureDesc.type();
        if (!type.has_multiarraytype() || type.Type_case() != Specification::FeatureType::kMultiArrayType) {
            // Invalid type
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::FeatureType::kMultiArrayType))
            << " with data type of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        if (type.multiarraytype().datatype() != allowedArrayFeatureDataType) {
            std::stringstream out;
            out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(type.multiarraytype().datatype()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        int shapeSize = type.multiarraytype().shape_size();
        if (shapeSize<shapeSizeMin || shapeSizeMax < shapeSize) {
            std::stringstream out;
            out << "Unsupported array rank " << shapeSize
            << " should be in range [" << shapeSizeMin << "," << shapeSizeMax << "]"
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        // no invariant broken -- type matches one of the allowed types
        return Result();
    }